

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::AppendCustomCommandSideEffects
          (cmGeneratorTarget *this,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *sideEffects)

{
  bool bVar1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar2;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *this_00;
  cmCustomCommand *pcVar3;
  cmGeneratorTarget *local_58;
  reference local_50;
  AllConfigSource *source;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *__range2;
  cmGeneratorTarget *local_20;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *local_18;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *sideEffects_local;
  cmGeneratorTarget *this_local;
  
  local_18 = sideEffects;
  sideEffects_local =
       (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        *)this;
  pvVar2 = GetPreBuildCommands(this);
  bVar1 = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::empty(pvVar2);
  if (bVar1) {
    pvVar2 = GetPreLinkCommands(this);
    bVar1 = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::empty(pvVar2);
    if (bVar1) {
      pvVar2 = GetPostBuildCommands(this);
      bVar1 = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::empty(pvVar2);
      if (bVar1) {
        this_00 = GetAllConfigSources(this);
        __end2 = std::
                 vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                 ::begin(this_00);
        source = (AllConfigSource *)
                 std::
                 vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                 ::end(this_00);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<const_cmGeneratorTarget::AllConfigSource_*,_std::vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>_>
                                      *)&source);
          if (!bVar1) {
            return;
          }
          local_50 = __gnu_cxx::
                     __normal_iterator<const_cmGeneratorTarget::AllConfigSource_*,_std::vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>_>
                     ::operator*(&__end2);
          pcVar3 = cmSourceFile::GetCustomCommand(local_50->Source);
          if (pcVar3 != (cmCustomCommand *)0x0) break;
          __gnu_cxx::
          __normal_iterator<const_cmGeneratorTarget::AllConfigSource_*,_std::vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>_>
          ::operator++(&__end2);
        }
        local_58 = this;
        std::
        set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        ::insert(local_18,&local_58);
        return;
      }
    }
  }
  local_20 = this;
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::insert(local_18,&local_20);
  return;
}

Assistant:

void cmGeneratorTarget::AppendCustomCommandSideEffects(
  std::set<cmGeneratorTarget const*>& sideEffects) const
{
  if (!this->GetPreBuildCommands().empty() ||
      !this->GetPreLinkCommands().empty() ||
      !this->GetPostBuildCommands().empty()) {
    sideEffects.insert(this);
  } else {
    for (auto const& source : this->GetAllConfigSources()) {
      if (source.Source->GetCustomCommand() != nullptr) {
        sideEffects.insert(this);
        break;
      }
    }
  }
}